

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O2

char * fmt::v11::detail::parse_precision<char>
                 (char *begin,char *end,format_specs *specs,arg_ref<char> *precision_ref,
                 parse_context<char> *ctx)

{
  parse_dynamic_spec_result<char> pVar1;
  
  if (begin + 1 != end) {
    pVar1 = parse_dynamic_spec<char>(begin + 1,end,&specs->precision,precision_ref,ctx);
    (specs->super_basic_specs).data_ =
         pVar1.kind << 8 | (specs->super_basic_specs).data_ & 0xfffffcff;
    return pVar1.end;
  }
  report_error("invalid precision");
}

Assistant:

FMT_CONSTEXPR auto parse_precision(const Char* begin, const Char* end,
                                   format_specs& specs,
                                   arg_ref<Char>& precision_ref,
                                   parse_context<Char>& ctx) -> const Char* {
  ++begin;
  if (begin == end) {
    report_error("invalid precision");
    return begin;
  }
  auto result =
      parse_dynamic_spec(begin, end, specs.precision, precision_ref, ctx);
  specs.set_dynamic_precision(result.kind);
  return result.end;
}